

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

string * random_hex_string_abi_cxx11_(uint64_t length)

{
  long lVar1;
  initializer_list<unsigned_int> __il;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  ulong in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  uint64_t i;
  string *result;
  int in_stack_ffffffffffffff78;
  result_type in_stack_ffffffffffffff7c;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff80;
  ulong local_50;
  random_device *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  if ((char)in_FS_OFFSET[-0x142] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::random_device::random_device(in_stack_ffffffffffffffc0);
    __cxa_thread_atexit(std::random_device::~random_device,lVar1 + -0x1d98,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x142) = 1;
  }
  if ((char)in_FS_OFFSET[-0x13e] == '\0') {
    lVar1 = *in_FS_OFFSET;
    in_stack_ffffffffffffff80 =
         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)(lVar1 + -0x1d98);
    rVar2 = std::random_device::operator()((random_device *)0x1b56e7);
    rVar3 = std::random_device::operator()((random_device *)0x1b56f5);
    std::random_device::operator()((random_device *)0x1b5703);
    std::random_device::operator()((random_device *)0x1b5711);
    __il._M_array._7_1_ = in_stack_ffffffffffffffcf;
    __il._M_array._0_7_ = in_stack_ffffffffffffffc8;
    __il._M_len._0_4_ = rVar2;
    __il._M_len._4_4_ = rVar3;
    std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)in_stack_ffffffffffffffc0,__il);
    __cxa_thread_atexit(std::seed_seq::~seed_seq,lVar1 + -0xa08,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13e) = 1;
  }
  if ((char)in_FS_OFFSET[-4] == '\0') {
    std::
    mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>
    ::mersenne_twister_engine<std::seed_seq,void>
              (in_stack_ffffffffffffff80,
               (seed_seq *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    *(undefined1 *)(in_FS_OFFSET + -4) = 1;
  }
  if (*(char *)((long)in_FS_OFFSET + -0x14) == '\0') {
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78);
    *(undefined1 *)((long)in_FS_OFFSET + -0x14) = 1;
  }
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_50 = 0; local_50 < in_RSI; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff7c =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)in_stack_ffffffffffffff80,
                    (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::__cxx11::string::operator+=((string *)in_RDI,"0123456789abcdef"[in_stack_ffffffffffffff7c])
    ;
  }
  return in_RDI;
}

Assistant:

std::string random_hex_string(uint64_t length) {
    constexpr static char charset[] = "0123456789abcdef";
    thread_local static std::random_device rd;
    thread_local static std::seed_seq seed{
        rd(), rd(), rd(), rd()};  // A bit better than pathetic default
    thread_local static std::mt19937_64 random(seed);
    thread_local static std::uniform_int_distribution<int> pick(
        0, sizeof(charset) - 2);

    std::string result;
    result.reserve(length);

    for (uint64_t i = 0; i < length; i++) {
        result += charset[pick(random)];
    }

    return result;
}